

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

xmlXIncludeRefPtr xmlXIncludeAddNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int newSize;
  xmlXIncludeRefPtr *table;
  int res;
  int local;
  int xml;
  xmlChar *tmp;
  xmlChar *base;
  xmlChar *fragment;
  xmlChar *parse;
  xmlChar *href;
  xmlURIPtr uri;
  xmlXIncludeRefPtr ret;
  xmlXIncludeRefPtr ref;
  xmlNodePtr cur_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  ret = (xmlXIncludeRefPtr)0x0;
  uri = (xmlURIPtr)0x0;
  href = (xmlChar *)0x0;
  parse = (xmlChar *)0x0;
  fragment = (xmlChar *)0x0;
  base = (xmlChar *)0x0;
  tmp = (xmlChar *)0x0;
  res = 1;
  if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  ref = (xmlXIncludeRefPtr)cur;
  cur_local = (xmlNodePtr)ctxt;
  base = xmlXIncludeGetProp(ctxt,cur,(xmlChar *)"xpointer");
  parse = xmlXIncludeGetProp((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,"href");
  if (parse == (xmlChar *)0x0) {
    if (base == (xmlChar *)0x0) {
      xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x643,
                     "href or xpointer must be present\n",fragment);
      goto LAB_0021a07c;
    }
    parse = xmlStrdup("");
    if (parse == (xmlChar *)0x0) {
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
      goto LAB_0021a07c;
    }
  }
  else {
    iVar2 = xmlStrlen(parse);
    if (2000 < iVar2) {
      xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x645,"URI too long\n",
                     (xmlChar *)0x0);
      goto LAB_0021a07c;
    }
  }
  fragment = xmlXIncludeGetProp((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,(xmlChar *)"parse");
  if (fragment != (xmlChar *)0x0) {
    iVar2 = xmlStrEqual(fragment,(xmlChar *)"xml");
    if (iVar2 == 0) {
      iVar2 = xmlStrEqual(fragment,"text");
      if (iVar2 == 0) {
        xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x641,
                       "invalid value %s for \'parse\'\n",fragment);
        goto LAB_0021a07c;
      }
      res = 0;
    }
    else {
      res = 1;
    }
  }
  iVar2 = xmlParseURISafe((char *)parse,(xmlURIPtr *)&href);
  if (href == (xmlChar *)0x0) {
    if (iVar2 < 0) {
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
    }
    else {
      xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x645,"invalid value href %s\n",
                     parse);
    }
  }
  else {
    if (*(long *)(href + 0x40) != 0) {
      if (*(int *)((long)&cur_local->doc + 4) == 0) {
        xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x652,
                       "Invalid fragment identifier in URI %s use the xpointer attribute\n",parse);
        goto LAB_0021a07c;
      }
      if (base == (xmlChar *)0x0) {
        base = *(xmlChar **)(href + 0x40);
      }
      else {
        (*xmlFree)(*(void **)(href + 0x40));
      }
      href[0x40] = '\0';
      href[0x41] = '\0';
      href[0x42] = '\0';
      href[0x43] = '\0';
      href[0x44] = '\0';
      href[0x45] = '\0';
      href[0x46] = '\0';
      href[0x47] = '\0';
    }
    _local = xmlSaveUri((xmlURIPtr)href);
    if (_local == (xmlChar *)0x0) {
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
    }
    else {
      (*xmlFree)(parse);
      parse = _local;
      iVar2 = xmlNodeGetBaseSafe((xmlDoc *)cur_local->_private,(xmlNode *)ref,&tmp);
      if (iVar2 < 0) {
        xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
      }
      else {
        if (*parse == '\0') {
          bVar4 = true;
        }
        else {
          iVar2 = xmlBuildURISafe(parse,tmp,(xmlChar **)&local);
          if (iVar2 < 0) {
            xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
            goto LAB_0021a07c;
          }
          if (_local == (xmlChar *)0x0) {
            xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x645,"failed build URL\n",
                           (xmlChar *)0x0);
            goto LAB_0021a07c;
          }
          (*xmlFree)(parse);
          parse = _local;
          iVar2 = xmlStrEqual(_local,*(xmlChar **)((long)cur_local->_private + 0x88));
          bVar4 = iVar2 != 0;
        }
        if (((bVar4) && (res == 1)) && ((base == (xmlChar *)0x0 || (*base == '\0')))) {
          xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,(xmlNodePtr)ref,0x640,
                         "detected a local recursion with no xpointer in %s\n",parse);
        }
        else {
          ret = (xmlXIncludeRefPtr)(*xmlMalloc)(0x38);
          if (ret == (xmlXIncludeRefPtr)0x0) {
            xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
          }
          else {
            memset(ret,0,0x38);
            ret->elem = (xmlNodePtr)ref;
            ret->xml = res;
            ret->URI = parse;
            parse = (xmlChar *)0x0;
            ret->fragment = base;
            base = (xmlChar *)0x0;
            if (((((ulong)cur_local->ns & 0x40000) == 0) && (ref[1].fragment != (xmlChar *)0x0)) &&
               ((*(uint *)(ref[1].fragment + 0xa8) & 0x40000) == 0)) {
              if (tmp == (xmlChar *)0x0) {
                pxVar3 = xmlStrdup("");
                ret->base = pxVar3;
                if (ret->base == (xmlChar *)0x0) {
                  xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
                  goto LAB_0021a07c;
                }
              }
              else {
                ret->base = tmp;
                tmp = (xmlChar *)0x0;
              }
            }
            if (*(int *)&cur_local->field_0xc <= (int)cur_local->type) {
              iVar2 = xmlGrowCapacity(*(int *)&cur_local->field_0xc,8,4,1000000000);
              if (iVar2 < 0) {
                xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
                goto LAB_0021a07c;
              }
              pxVar3 = (xmlChar *)(*xmlRealloc)(cur_local->name,(long)iVar2 << 3);
              if (pxVar3 == (xmlChar *)0x0) {
                xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
                goto LAB_0021a07c;
              }
              cur_local->name = pxVar3;
              *(int *)&cur_local->field_0xc = iVar2;
            }
            xVar1 = cur_local->type;
            cur_local->type = xVar1 + XML_ELEMENT_NODE;
            *(xmlXIncludeRefPtr *)(cur_local->name + (long)(int)xVar1 * 8) = ret;
            uri = (xmlURIPtr)ret;
            ret = (xmlXIncludeRefPtr)0x0;
          }
        }
      }
    }
  }
LAB_0021a07c:
  xmlXIncludeFreeRef(ret);
  xmlFreeURI((xmlURIPtr)href);
  (*xmlFree)(parse);
  (*xmlFree)(fragment);
  (*xmlFree)(base);
  (*xmlFree)(tmp);
  return (xmlXIncludeRefPtr)uri;
}

Assistant:

static xmlXIncludeRefPtr
xmlXIncludeAddNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr cur) {
    xmlXIncludeRefPtr ref = NULL;
    xmlXIncludeRefPtr ret = NULL;
    xmlURIPtr uri = NULL;
    xmlChar *href = NULL;
    xmlChar *parse = NULL;
    xmlChar *fragment = NULL;
    xmlChar *base = NULL;
    xmlChar *tmp;
    int xml = 1;
    int local = 0;
    int res;

    if (ctxt == NULL)
	return(NULL);
    if (cur == NULL)
	return(NULL);

    /*
     * read the attributes
     */

    fragment = xmlXIncludeGetProp(ctxt, cur, XINCLUDE_PARSE_XPOINTER);

    href = xmlXIncludeGetProp(ctxt, cur, XINCLUDE_HREF);
    if (href == NULL) {
        if (fragment == NULL) {
	    xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_NO_HREF,
	                   "href or xpointer must be present\n", parse);
	    goto error;
        }

	href = xmlStrdup(BAD_CAST ""); /* @@@@ href is now optional */
	if (href == NULL) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
    } else if (xmlStrlen(href) > XML_MAX_URI_LENGTH) {
        xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_HREF_URI, "URI too long\n",
                       NULL);
        goto error;
    }

    parse = xmlXIncludeGetProp(ctxt, cur, XINCLUDE_PARSE);
    if (parse != NULL) {
	if (xmlStrEqual(parse, XINCLUDE_PARSE_XML))
	    xml = 1;
	else if (xmlStrEqual(parse, XINCLUDE_PARSE_TEXT))
	    xml = 0;
	else {
	    xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_PARSE_VALUE,
	                   "invalid value %s for 'parse'\n", parse);
	    goto error;
	}
    }

    /*
     * Check the URL and remove any fragment identifier
     */
    res = xmlParseURISafe((const char *)href, &uri);
    if (uri == NULL) {
        if (res < 0)
            xmlXIncludeErrMemory(ctxt);
        else
            xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_HREF_URI,
                           "invalid value href %s\n", href);
        goto error;
    }

    if (uri->fragment != NULL) {
        if (ctxt->legacy != 0) {
	    if (fragment == NULL) {
		fragment = (xmlChar *) uri->fragment;
	    } else {
		xmlFree(uri->fragment);
	    }
	} else {
	    xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_FRAGMENT_ID,
       "Invalid fragment identifier in URI %s use the xpointer attribute\n",
                           href);
	    goto error;
	}
	uri->fragment = NULL;
    }
    tmp = xmlSaveUri(uri);
    if (tmp == NULL) {
	xmlXIncludeErrMemory(ctxt);
	goto error;
    }
    xmlFree(href);
    href = tmp;

    /*
     * Resolve URI
     */

    if (xmlNodeGetBaseSafe(ctxt->doc, cur, &base) < 0) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }

    if (href[0] != 0) {
        if (xmlBuildURISafe(href, base, &tmp) < 0) {
            xmlXIncludeErrMemory(ctxt);
            goto error;
        }
        if (tmp == NULL) {
            xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_HREF_URI,
                           "failed build URL\n", NULL);
            goto error;
        }
        xmlFree(href);
        href = tmp;

        if (xmlStrEqual(href, ctxt->doc->URL))
            local = 1;
    } else {
        local = 1;
    }

    /*
     * If local and xml then we need a fragment
     */
    if ((local == 1) && (xml == 1) &&
        ((fragment == NULL) || (fragment[0] == 0))) {
	xmlXIncludeErr(ctxt, cur, XML_XINCLUDE_RECURSION,
	               "detected a local recursion with no xpointer in %s\n",
		       href);
	goto error;
    }

    ref = (xmlXIncludeRefPtr) xmlMalloc(sizeof(xmlXIncludeRef));
    if (ref == NULL) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    memset(ref, 0, sizeof(xmlXIncludeRef));

    ref->elem = cur;
    ref->xml = xml;
    ref->URI = href;
    href = NULL;
    ref->fragment = fragment;
    fragment = NULL;

    /*
     * xml:base fixup
     */
    if (((ctxt->parseFlags & XML_PARSE_NOBASEFIX) == 0) &&
        (cur->doc != NULL) &&
        ((cur->doc->parseFlags & XML_PARSE_NOBASEFIX) == 0)) {
        if (base != NULL) {
            ref->base = base;
            base = NULL;
        } else {
            ref->base = xmlStrdup(BAD_CAST "");
            if (ref->base == NULL) {
	        xmlXIncludeErrMemory(ctxt);
                goto error;
            }
        }
    }

    if (ctxt->incNr >= ctxt->incMax) {
        xmlXIncludeRefPtr *table;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->incMax, sizeof(table[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlXIncludeErrMemory(ctxt);
	    goto error;
	}
        table = xmlRealloc(ctxt->incTab, newSize * sizeof(table[0]));
        if (table == NULL) {
	    xmlXIncludeErrMemory(ctxt);
	    goto error;
	}
        ctxt->incTab = table;
        ctxt->incMax = newSize;
    }
    ctxt->incTab[ctxt->incNr++] = ref;

    ret = ref;
    ref = NULL;

error:
    xmlXIncludeFreeRef(ref);
    xmlFreeURI(uri);
    xmlFree(href);
    xmlFree(parse);
    xmlFree(fragment);
    xmlFree(base);
    return(ret);
}